

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O1

bool idx2::CreateFullDir(stref *Path)

{
  int iVar1;
  cstr __s;
  char *pcVar2;
  
  __s = ToString(Path);
  for (pcVar2 = strchr(__s,0x2f); pcVar2 != (char *)0x0; pcVar2 = strchr(pcVar2 + 1,0x2f)) {
    *pcVar2 = '\0';
    mkdir(__s,0x1db);
    *pcVar2 = '/';
  }
  iVar1 = mkdir(__s,0x1db);
  return iVar1 == 0;
}

Assistant:

bool
CreateFullDir(const stref& Path)
{
  cstr PathCopy = ToString(Path);
  int Error = 0;
  str P = (str)PathCopy;

  for // loop through the components (between two '/')
  (
    P = (str)strchr(PathCopy, '/');
    P;
    P = (str)strchr(P + 1, '/')
  )
  {
    *P = '\0';
    Error = MkDir(PathCopy);
    *P = '/';
  }

  Error = MkDir(PathCopy);

  return (Error == 0);
}